

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_mime_message.c
# Opt level: O0

void usage(void)

{
  printf("\n");
  printf("libcmime - simple api demonstration\n");
  printf("-----------------------------------\n");
  printf("demonstrates: parsing an email message \n");
  printf("output: output is written to stdout if no output file is specified\n");
  printf("required parameter: -i /path/to/input_file\n");
  return;
}

Assistant:

void usage() {
    printf("\n");
    printf("libcmime - simple api demonstration\n");
    printf("-----------------------------------\n");
    printf("demonstrates: parsing an email message \n");
    printf("output: output is written to stdout if no output file is specified\n");
    printf("required parameter: -i /path/to/input_file\n");
}